

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Path.cpp
# Opt level: O2

file_type llvm::sys::fs::get_file_type(Twine *Path,bool Follow)

{
  file_type fVar1;
  error_code eVar2;
  file_status local_48;
  
  local_48.super_basic_file_status.fs_st_size._0_4_ = 0;
  local_48.super_basic_file_status._36_8_ = 0;
  local_48.super_basic_file_status.fs_st_atime_nsec = 0;
  local_48.super_basic_file_status.fs_st_mtime_nsec = 0;
  local_48.super_basic_file_status.fs_st_uid = 0;
  local_48.super_basic_file_status.fs_st_gid = 0;
  local_48.super_basic_file_status.fs_st_atime = 0;
  local_48.super_basic_file_status.fs_st_mtime = 0;
  eVar2 = status(Path,&local_48,Follow);
  fVar1 = status_error;
  if (eVar2._M_value == 0) {
    fVar1 = local_48.super_basic_file_status.Type;
  }
  return fVar1;
}

Assistant:

file_type get_file_type(const Twine &Path, bool Follow) {
  file_status st;
  if (status(Path, st, Follow))
    return file_type::status_error;
  return st.type();
}